

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

void __thiscall
google::anon_unknown_1::CommandLineFlag::FillCommandLineFlagInfo
          (CommandLineFlag *this,CommandLineFlagInfo *result)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  string local_48;
  
  pcVar1 = this->name_;
  pcVar2 = (char *)(result->name)._M_string_length;
  strlen(pcVar1);
  std::__cxx11::string::_M_replace((ulong)result,0,pcVar2,(ulong)pcVar1);
  lVar4 = (long)this->defvalue_->type_;
  if (lVar4 < 7) {
    pcVar1 = (char *)(result->type)._M_string_length;
    strlen(&(anonymous_namespace)::FlagValue::TypeName()::types + lVar4 * 7);
    std::__cxx11::string::_M_replace
              ((ulong)&result->type,0,pcVar1,
               (ulong)(&(anonymous_namespace)::FlagValue::TypeName()::types + lVar4 * 7));
    pcVar1 = this->help_;
    pcVar2 = (char *)(result->description)._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&result->description,0,pcVar2,(ulong)pcVar1);
    (anonymous_namespace)::FlagValue::ToString_abi_cxx11_(&local_48,this->current_);
    std::__cxx11::string::operator=((string *)&result->current_value,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    (anonymous_namespace)::FlagValue::ToString_abi_cxx11_(&local_48,this->defvalue_);
    std::__cxx11::string::operator=((string *)&result->default_value,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    pcVar1 = this->file_;
    pcVar2 = (char *)(result->filename)._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&result->filename,0,pcVar2,(ulong)pcVar1);
    if (this->modified_ == false) {
      bVar3 = FlagValue::Equal(this->current_,this->defvalue_);
      if (!bVar3) {
        this->modified_ = true;
      }
    }
    result->is_default = (bool)(this->modified_ ^ 1);
    result->has_validator_fn = this->validate_fn_proto_ != (ValidateFnProto)0x0;
    result->flag_ptr = this->current_->value_buffer_;
    return;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                ,0x1a2,"const char *google::(anonymous namespace)::FlagValue::TypeName() const");
}

Assistant:

void CommandLineFlag::FillCommandLineFlagInfo(
    CommandLineFlagInfo* result) {
  result->name = name();
  result->type = type_name();
  result->description = help();
  result->current_value = current_value();
  result->default_value = default_value();
  result->filename = CleanFileName();
  UpdateModifiedBit();
  result->is_default = !modified_;
  result->has_validator_fn = validate_function() != NULL;
  result->flag_ptr = flag_ptr();
}